

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cpp
# Opt level: O2

void __thiscall DSDcc::CRC::generate_crc_table(CRC *this)

{
  int iVar1;
  uint bitnum;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  unsigned_long uVar5;
  ulong crc;
  int iVar6;
  ulong uVar7;
  CRC *this_00;
  unsigned_long crc_00;
  bool bVar8;
  
  iVar1 = this->m_refin;
  bitnum = this->m_order;
  uVar2 = this->m_crchighbit;
  uVar3 = this->m_poly;
  uVar4 = this->m_crcmask;
  this_00 = this;
  for (crc_00 = 0; crc_00 != 0x100; crc_00 = crc_00 + 1) {
    uVar5 = crc_00;
    if (iVar1 != 0) {
      uVar5 = reflect(this_00,crc_00,8);
    }
    crc = uVar5 << ((char)bitnum - 8U & 0x3f);
    iVar6 = 8;
    while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
      uVar7 = uVar2 & crc;
      if (uVar7 != 0) {
        uVar7 = uVar3;
      }
      crc = crc * 2 ^ uVar7;
    }
    if (iVar1 != 0) {
      crc = reflect(this_00,crc,bitnum);
    }
    this->m_crctab[crc_00] = crc & uVar4;
  }
  return;
}

Assistant:

void CRC::generate_crc_table()
{
    // make CRC lookup table used by table algorithms

    int i, j;
    unsigned long bit, crc;

    for (i = 0; i < 256; i++)
    {
        crc = (unsigned long) i;

        if (m_refin)
            crc = reflect(crc, 8);

        crc <<= m_order - 8;

        for (j = 0; j < 8; j++)
        {
            bit = crc & m_crchighbit;
            crc <<= 1;

            if (bit)
                crc ^= m_poly;
        }

        if (m_refin)
            crc = reflect(crc, m_order);
        crc &= m_crcmask;
        m_crctab[i] = crc;
    }
}